

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void anon_unknown.dwarf_4c91f0::sha1::Transform(uint32_t *s,uchar *chunk)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t in_stack_fffffffffffffa48;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t in_stack_fffffffffffffa4c;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  uint32_t in_stack_fffffffffffffa58;
  uint32_t in_stack_fffffffffffffa5c;
  undefined4 in_stack_fffffffffffffa60;
  uint32_t uVar11;
  uint32_t a_00;
  uint32_t in_stack_fffffffffffffa80;
  uint32_t in_stack_fffffffffffffa88;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[2];
  uVar4 = in_RDI[3];
  uVar5 = in_RDI[4];
  uVar11 = uVar1;
  a_00 = uVar4;
  f1(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48,0);
  uVar7 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  uVar9 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar7),
        in_stack_fffffffffffffa4c,in_stack_fffffffffffffa80,in_stack_fffffffffffffa88);
  uVar9 = f1(in_stack_fffffffffffffa4c,uVar9,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar7));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,in_stack_fffffffffffffa88);
  uVar7 = uVar1;
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = ReadBE32((uchar *)CONCAT44(in_stack_fffffffffffffa54,uVar8));
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f1(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x5a827999;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x6ed9eba1;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f3(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0x8f1bbcdc;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  uVar10 = 0xca62c1d6;
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  f2(in_stack_fffffffffffffa4c,uVar10,0);
  uVar8 = left(in_stack_fffffffffffffa4c);
  Round(a_00,(uint32_t *)CONCAT44(uVar11,in_stack_fffffffffffffa60),in_stack_fffffffffffffa5c,
        in_stack_fffffffffffffa58,(uint32_t *)CONCAT44(in_stack_fffffffffffffa54,uVar8),
        in_stack_fffffffffffffa4c,uVar9,uVar7);
  *in_RDI = *in_RDI + uVar1;
  in_RDI[1] = in_RDI[1] + uVar2;
  in_RDI[2] = in_RDI[2] + uVar3;
  in_RDI[3] = in_RDI[3] + uVar4;
  in_RDI[4] = in_RDI[4] + uVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar6) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk)
{
    uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4];
    uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f1(b, c, d), k1, w0 = ReadBE32(chunk + 0));
    Round(e, a, b, c, d, f1(a, b, c), k1, w1 = ReadBE32(chunk + 4));
    Round(d, e, a, b, c, f1(e, a, b), k1, w2 = ReadBE32(chunk + 8));
    Round(c, d, e, a, b, f1(d, e, a), k1, w3 = ReadBE32(chunk + 12));
    Round(b, c, d, e, a, f1(c, d, e), k1, w4 = ReadBE32(chunk + 16));
    Round(a, b, c, d, e, f1(b, c, d), k1, w5 = ReadBE32(chunk + 20));
    Round(e, a, b, c, d, f1(a, b, c), k1, w6 = ReadBE32(chunk + 24));
    Round(d, e, a, b, c, f1(e, a, b), k1, w7 = ReadBE32(chunk + 28));
    Round(c, d, e, a, b, f1(d, e, a), k1, w8 = ReadBE32(chunk + 32));
    Round(b, c, d, e, a, f1(c, d, e), k1, w9 = ReadBE32(chunk + 36));
    Round(a, b, c, d, e, f1(b, c, d), k1, w10 = ReadBE32(chunk + 40));
    Round(e, a, b, c, d, f1(a, b, c), k1, w11 = ReadBE32(chunk + 44));
    Round(d, e, a, b, c, f1(e, a, b), k1, w12 = ReadBE32(chunk + 48));
    Round(c, d, e, a, b, f1(d, e, a), k1, w13 = ReadBE32(chunk + 52));
    Round(b, c, d, e, a, f1(c, d, e), k1, w14 = ReadBE32(chunk + 56));
    Round(a, b, c, d, e, f1(b, c, d), k1, w15 = ReadBE32(chunk + 60));

    Round(e, a, b, c, d, f1(a, b, c), k1, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(d, e, a, b, c, f1(e, a, b), k1, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(c, d, e, a, b, f1(d, e, a), k1, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(b, c, d, e, a, f1(c, d, e), k1, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(a, b, c, d, e, f2(b, c, d), k2, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(e, a, b, c, d, f2(a, b, c), k2, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(d, e, a, b, c, f2(e, a, b), k2, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(c, d, e, a, b, f2(d, e, a), k2, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(b, c, d, e, a, f2(c, d, e), k2, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(a, b, c, d, e, f2(b, c, d), k2, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(e, a, b, c, d, f2(a, b, c), k2, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(d, e, a, b, c, f2(e, a, b), k2, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(c, d, e, a, b, f2(d, e, a), k2, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(b, c, d, e, a, f2(c, d, e), k2, w13 = left(w13 ^ w10 ^ w5 ^ w15));
    Round(a, b, c, d, e, f2(b, c, d), k2, w14 = left(w14 ^ w11 ^ w6 ^ w0));
    Round(e, a, b, c, d, f2(a, b, c), k2, w15 = left(w15 ^ w12 ^ w7 ^ w1));

    Round(d, e, a, b, c, f2(e, a, b), k2, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(c, d, e, a, b, f2(d, e, a), k2, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(b, c, d, e, a, f2(c, d, e), k2, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(a, b, c, d, e, f2(b, c, d), k2, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(e, a, b, c, d, f2(a, b, c), k2, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(d, e, a, b, c, f2(e, a, b), k2, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(c, d, e, a, b, f2(d, e, a), k2, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(b, c, d, e, a, f2(c, d, e), k2, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(a, b, c, d, e, f3(b, c, d), k3, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(e, a, b, c, d, f3(a, b, c), k3, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(d, e, a, b, c, f3(e, a, b), k3, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(c, d, e, a, b, f3(d, e, a), k3, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(b, c, d, e, a, f3(c, d, e), k3, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(a, b, c, d, e, f3(b, c, d), k3, w13 = left(w13 ^ w10 ^ w5 ^ w15));
    Round(e, a, b, c, d, f3(a, b, c), k3, w14 = left(w14 ^ w11 ^ w6 ^ w0));
    Round(d, e, a, b, c, f3(e, a, b), k3, w15 = left(w15 ^ w12 ^ w7 ^ w1));

    Round(c, d, e, a, b, f3(d, e, a), k3, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(b, c, d, e, a, f3(c, d, e), k3, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(a, b, c, d, e, f3(b, c, d), k3, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(e, a, b, c, d, f3(a, b, c), k3, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(d, e, a, b, c, f3(e, a, b), k3, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(c, d, e, a, b, f3(d, e, a), k3, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(b, c, d, e, a, f3(c, d, e), k3, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(a, b, c, d, e, f3(b, c, d), k3, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(e, a, b, c, d, f3(a, b, c), k3, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(d, e, a, b, c, f3(e, a, b), k3, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(c, d, e, a, b, f3(d, e, a), k3, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(b, c, d, e, a, f3(c, d, e), k3, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(a, b, c, d, e, f2(b, c, d), k4, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(e, a, b, c, d, f2(a, b, c), k4, w13 = left(w13 ^ w10 ^ w5 ^ w15));
    Round(d, e, a, b, c, f2(e, a, b), k4, w14 = left(w14 ^ w11 ^ w6 ^ w0));
    Round(c, d, e, a, b, f2(d, e, a), k4, w15 = left(w15 ^ w12 ^ w7 ^ w1));

    Round(b, c, d, e, a, f2(c, d, e), k4, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(a, b, c, d, e, f2(b, c, d), k4, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(e, a, b, c, d, f2(a, b, c), k4, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(d, e, a, b, c, f2(e, a, b), k4, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(c, d, e, a, b, f2(d, e, a), k4, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(b, c, d, e, a, f2(c, d, e), k4, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(a, b, c, d, e, f2(b, c, d), k4, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(e, a, b, c, d, f2(a, b, c), k4, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(d, e, a, b, c, f2(e, a, b), k4, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(c, d, e, a, b, f2(d, e, a), k4, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(b, c, d, e, a, f2(c, d, e), k4, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(a, b, c, d, e, f2(b, c, d), k4, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(e, a, b, c, d, f2(a, b, c), k4, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(d, e, a, b, c, f2(e, a, b), k4, left(w13 ^ w10 ^ w5 ^ w15));
    Round(c, d, e, a, b, f2(d, e, a), k4, left(w14 ^ w11 ^ w6 ^ w0));
    Round(b, c, d, e, a, f2(c, d, e), k4, left(w15 ^ w12 ^ w7 ^ w1));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
}